

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_debug_helpers_generated.c
# Opt level: O0

char * mbedtls_ssl_sig_alg_to_str(uint16_t in)

{
  char *pcStack_10;
  uint16_t in_local;
  
  if (in == 0) {
    pcStack_10 = "none";
  }
  else if (in == 0x201) {
    pcStack_10 = "rsa_pkcs1_sha1";
  }
  else if (in == 0x203) {
    pcStack_10 = "ecdsa_sha1";
  }
  else if (in == 0x401) {
    pcStack_10 = "rsa_pkcs1_sha256";
  }
  else if (in == 0x403) {
    pcStack_10 = "ecdsa_secp256r1_sha256";
  }
  else if (in == 0x501) {
    pcStack_10 = "rsa_pkcs1_sha384";
  }
  else if (in == 0x503) {
    pcStack_10 = "ecdsa_secp384r1_sha384";
  }
  else if (in == 0x601) {
    pcStack_10 = "rsa_pkcs1_sha512";
  }
  else if (in == 0x603) {
    pcStack_10 = "ecdsa_secp521r1_sha512";
  }
  else if (in == 0x804) {
    pcStack_10 = "rsa_pss_rsae_sha256";
  }
  else if (in == 0x805) {
    pcStack_10 = "rsa_pss_rsae_sha384";
  }
  else if (in == 0x806) {
    pcStack_10 = "rsa_pss_rsae_sha512";
  }
  else if (in == 0x807) {
    pcStack_10 = "ed25519";
  }
  else if (in == 0x808) {
    pcStack_10 = "ed448";
  }
  else if (in == 0x809) {
    pcStack_10 = "rsa_pss_pss_sha256";
  }
  else if (in == 0x80a) {
    pcStack_10 = "rsa_pss_pss_sha384";
  }
  else if (in == 0x80b) {
    pcStack_10 = "rsa_pss_pss_sha512";
  }
  else {
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char *mbedtls_ssl_sig_alg_to_str( uint16_t in )
{
    switch( in )
    {
    case MBEDTLS_TLS1_3_SIG_RSA_PKCS1_SHA256:
        return "rsa_pkcs1_sha256";
    case MBEDTLS_TLS1_3_SIG_RSA_PKCS1_SHA384:
        return "rsa_pkcs1_sha384";
    case MBEDTLS_TLS1_3_SIG_RSA_PKCS1_SHA512:
        return "rsa_pkcs1_sha512";
    case MBEDTLS_TLS1_3_SIG_ECDSA_SECP256R1_SHA256:
        return "ecdsa_secp256r1_sha256";
    case MBEDTLS_TLS1_3_SIG_ECDSA_SECP384R1_SHA384:
        return "ecdsa_secp384r1_sha384";
    case MBEDTLS_TLS1_3_SIG_ECDSA_SECP521R1_SHA512:
        return "ecdsa_secp521r1_sha512";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_RSAE_SHA256:
        return "rsa_pss_rsae_sha256";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_RSAE_SHA384:
        return "rsa_pss_rsae_sha384";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_RSAE_SHA512:
        return "rsa_pss_rsae_sha512";
    case MBEDTLS_TLS1_3_SIG_ED25519:
        return "ed25519";
    case MBEDTLS_TLS1_3_SIG_ED448:
        return "ed448";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_PSS_SHA256:
        return "rsa_pss_pss_sha256";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_PSS_SHA384:
        return "rsa_pss_pss_sha384";
    case MBEDTLS_TLS1_3_SIG_RSA_PSS_PSS_SHA512:
        return "rsa_pss_pss_sha512";
    case MBEDTLS_TLS1_3_SIG_RSA_PKCS1_SHA1:
        return "rsa_pkcs1_sha1";
    case MBEDTLS_TLS1_3_SIG_ECDSA_SHA1:
        return "ecdsa_sha1";
    case MBEDTLS_TLS1_3_SIG_NONE:
        return "none";
    };

    return "UNKNOWN";
}